

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeInvokeBusyHandler(void *pArg)

{
  int iVar1;
  BtShared *pBt;
  void *pArg_local;
  
  iVar1 = sqlite3InvokeBusyHandler((BusyHandler *)(*(long *)((long)pArg + 8) + 0x2a8));
  return iVar1;
}

Assistant:

static int btreeInvokeBusyHandler(void *pArg){
  BtShared *pBt = (BtShared*)pArg;
  assert( pBt->db );
  assert( sqlite3_mutex_held(pBt->db->mutex) );
  return sqlite3InvokeBusyHandler(&pBt->db->busyHandler);
}